

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevoluteSpherical.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkRevoluteSpherical::ConstraintsBiLoad_C
          (ChLinkRevoluteSpherical *this,double factor,double recovery_clamp,bool do_clamp)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  undefined1 auVar5 [16];
  double dVar6;
  undefined1 auVar7 [16];
  double dVar8;
  undefined8 in_XMM1_Qb;
  undefined1 auVar9 [16];
  
  iVar4 = (*(this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])();
  if ((char)iVar4 != '\0') {
    dVar6 = (this->m_cur_dist - this->m_dist) * factor;
    if (do_clamp) {
      auVar2._8_8_ = in_XMM1_Qb;
      auVar2._0_8_ = recovery_clamp;
      auVar5._8_8_ = 0x8000000000000000;
      auVar5._0_8_ = 0x8000000000000000;
      auVar5 = vxorpd_avx512vl(auVar2,auVar5);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = dVar6;
      auVar5 = vmaxsd_avx(auVar7,auVar5);
      auVar5 = vminsd_avx(auVar5,auVar2);
      dVar6 = auVar5._0_8_;
    }
    dVar8 = factor * this->m_cur_dot;
    if (do_clamp) {
      auVar3._8_8_ = in_XMM1_Qb;
      auVar3._0_8_ = recovery_clamp;
      auVar1._8_8_ = 0x8000000000000000;
      auVar1._0_8_ = 0x8000000000000000;
      auVar5 = vxorpd_avx512vl(auVar3,auVar1);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = dVar8;
      auVar5 = vmaxsd_avx(auVar9,auVar5);
      auVar5 = vminsd_avx(auVar5,auVar3);
      dVar8 = auVar5._0_8_;
    }
    (this->m_cnstr_dist).super_ChConstraintTwo.super_ChConstraint.b_i =
         dVar6 + (this->m_cnstr_dist).super_ChConstraintTwo.super_ChConstraint.b_i;
    (this->m_cnstr_dot).super_ChConstraintTwo.super_ChConstraint.b_i =
         dVar8 + (this->m_cnstr_dot).super_ChConstraintTwo.super_ChConstraint.b_i;
  }
  return;
}

Assistant:

void ChLinkRevoluteSpherical::ConstraintsBiLoad_C(double factor, double recovery_clamp, bool do_clamp) {
    if (!IsActive())
        return;

    double cnstr_dist_violation = do_clamp
                                      ? ChMin(ChMax(factor * (m_cur_dist - m_dist), -recovery_clamp), recovery_clamp)
                                      : factor * (m_cur_dist - m_dist);

    double cnstr_dot_violation =
        do_clamp ? ChMin(ChMax(factor * m_cur_dot, -recovery_clamp), recovery_clamp) : factor * m_cur_dot;

    m_cnstr_dist.Set_b_i(m_cnstr_dist.Get_b_i() + cnstr_dist_violation);
    m_cnstr_dot.Set_b_i(m_cnstr_dot.Get_b_i() + cnstr_dot_violation);
}